

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void parse_command(int argc,char **argv)

{
  int iVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  size_type sVar4;
  iterator iVar5;
  int iVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  param;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_88;
  _Base_ptr local_80;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  string local_70;
  string local_50;
  
  sVar4 = args.command._M_string_length;
  if (argc != 1) {
    pcVar3 = argv[1];
    strlen(pcVar3);
    std::__cxx11::string::_M_replace(0x1529e0,0,(char *)sVar4,(ulong)pcVar3);
    if (2 < argc) {
      paVar2 = &local_c8.first.field_2;
      iVar6 = 2;
      local_80 = &hasargoption_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
      local_88 = (vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&args.options;
      local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args.packages
      ;
      do {
        pcVar3 = argv[iVar6];
        if (*pcVar3 == '-') {
          local_c8.first._M_string_length = 0;
          local_c8.first.field_2._M_local_buf[0] = '\0';
          local_c8.second._M_dataplus._M_p = (pointer)&local_c8.second.field_2;
          local_c8.second._M_string_length = 0;
          local_c8.second.field_2._M_local_buf[0] = '\0';
          local_c8.first._M_dataplus._M_p = (pointer)paVar2;
          strlen(pcVar3);
          std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,(ulong)pcVar3);
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&hasargoption_abi_cxx11_._M_t,&local_c8.first);
          sVar4 = local_c8.second._M_string_length;
          if ((iVar5._M_node != local_80) && (iVar1 = iVar6 + 1, iVar1 < argc)) {
            pcVar3 = argv[iVar1];
            strlen(pcVar3);
            std::__cxx11::string::_M_replace((ulong)&local_c8.second,0,(char *)sVar4,(ulong)pcVar3);
            iVar6 = iVar1;
          }
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>&>(local_88,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.second._M_dataplus._M_p != &local_c8.second.field_2) {
            operator_delete(local_c8.second._M_dataplus._M_p,
                            CONCAT71(local_c8.second.field_2._M_allocated_capacity._1_7_,
                                     local_c8.second.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8.first._M_dataplus._M_p != paVar2) {
            operator_delete(local_c8.first._M_dataplus._M_p,
                            CONCAT71(local_c8.first.field_2._M_allocated_capacity._1_7_,
                                     local_c8.first.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char*&>(local_78,argv + iVar6);
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < argc);
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if (((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&args), iVar6 == 0)) ||
       (iVar6 = std::__cxx11::string::compare((char *)&args), iVar6 == 0)) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      help_main(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&args), iVar6 == 0)) {
      print_version();
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if (iVar6 == 0) {
      parse_install();
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if (iVar6 == 0) {
      parse_download();
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if (iVar6 == 0) {
      parse_uninstall();
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if (iVar6 == 0) {
      parse_freeze();
    }
    iVar6 = std::__cxx11::string::compare((char *)&args);
    if (iVar6 == 0) {
      parse_archive();
    }
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  help_main(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void parse_command(int argc,char** argv) noexcept(false){
    if(argc==1){
        help_main();
        return;
    }
    args.command=argv[1];
    for(int i=2;i<argc;i++){
        if(argv[i][0]=='-') {
            std::pair<std::string,std::string> param;
            param.first=argv[i];
            if(hasargoption.find(param.first)!=hasargoption.end() && i+1<argc){
                param.second=argv[i+1];
                i++;
            }
            args.options.emplace_back(param);
        }else
            args.packages.emplace_back(argv[i]);
    }
    if(args.command=="help" || args.command=="-h" || args.command=="--help")
        help_main();
    if(args.command=="-V" || args.command=="--version")
        print_version();
    if(args.command=="install")
        parse_install();
    if(args.command=="download")
        parse_download();
    if(args.command=="uninstall")
        parse_uninstall();
    if(args.command=="freeze")
        parse_freeze();
    if(args.command=="archive")
        parse_archive();
}